

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O2

void duckdb::Bit::BitwiseOr(bitstring_t *rhs,bitstring_t *lhs,bitstring_t *result)

{
  idx_t iVar1;
  idx_t iVar2;
  char *pcVar3;
  InvalidInputException *this;
  idx_t i;
  ulong uVar4;
  undefined8 extraout_RDX;
  char *pcVar5;
  char *pcVar6;
  bitstring_t bits;
  bitstring_t bits_00;
  allocator local_61;
  Bit *local_60;
  Bit *local_58;
  string local_50;
  
  local_58 = *(Bit **)&lhs->value;
  pcVar6 = (lhs->value).pointer.ptr;
  bits.value.pointer.ptr = (char *)result;
  bits.value._0_8_ = pcVar6;
  iVar1 = BitLength(local_58,bits);
  local_60 = *(Bit **)&rhs->value;
  pcVar5 = (rhs->value).pointer.ptr;
  bits_00.value.pointer.ptr = (char *)extraout_RDX;
  bits_00.value._0_8_ = pcVar5;
  iVar2 = BitLength(local_60,bits_00);
  if (iVar1 == iVar2) {
    if ((result->value).pointer.length < 0xd) {
      pcVar3 = (result->value).pointer.prefix;
    }
    else {
      pcVar3 = (result->value).pointer.ptr;
    }
    if ((uint)local_60 < 0xd) {
      pcVar5 = (rhs->value).pointer.prefix;
    }
    if ((uint)local_58 < 0xd) {
      pcVar6 = (lhs->value).pointer.prefix;
    }
    *pcVar3 = *pcVar6;
    for (uVar4 = 1; uVar4 < (lhs->value).pointer.length; uVar4 = uVar4 + 1) {
      pcVar3[uVar4] = pcVar5[uVar4] | pcVar6[uVar4];
    }
    Finalize(result);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Cannot OR bit strings of different sizes",&local_61);
  InvalidInputException::InvalidInputException(this,&local_50);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Bit::BitwiseOr(const bitstring_t &rhs, const bitstring_t &lhs, bitstring_t &result) {
	if (Bit::BitLength(lhs) != Bit::BitLength(rhs)) {
		throw InvalidInputException("Cannot OR bit strings of different sizes");
	}

	uint8_t *buf = reinterpret_cast<uint8_t *>(result.GetDataWriteable());
	const uint8_t *r_buf = reinterpret_cast<const uint8_t *>(rhs.GetData());
	const uint8_t *l_buf = reinterpret_cast<const uint8_t *>(lhs.GetData());

	buf[0] = l_buf[0];
	for (idx_t i = 1; i < lhs.GetSize(); i++) {
		buf[i] = l_buf[i] | r_buf[i];
	}
	Bit::Finalize(result);
}